

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall
llvm::yaml::Scanner::findBlockScalarIndent
          (Scanner *this,uint *BlockIndent,uint BlockExitIndent,uint *LineBreaks,bool *IsDone)

{
  iterator pcVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  iterator pcVar6;
  iterator pcVar7;
  char *unaff_RBX;
  iterator Position;
  char *pcVar8;
  uint MaxAllSpaceLineCharacters;
  uint uVar9;
  Twine local_58;
  uint *local_40;
  uint local_34;
  
  uVar9 = 0;
  local_40 = BlockIndent;
  local_34 = BlockExitIndent;
  do {
    pcVar6 = this->End;
    pcVar7 = this->Current + -1;
    do {
      pcVar1 = pcVar7 + 1;
      Position = pcVar6;
      if (pcVar1 == pcVar6) goto LAB_00b3276e;
      pcVar2 = pcVar7 + 1;
      pcVar7 = pcVar1;
    } while (*pcVar2 == ' ');
    pcVar6 = pcVar1;
    Position = pcVar1 + (*pcVar2 == ' ');
LAB_00b3276e:
    this->Column = this->Column + ((int)pcVar6 - (int)this->Current);
    this->Current = Position;
    pcVar6 = skip_nb_char(this,Position);
    pcVar2 = this->Current;
    if (pcVar6 != pcVar2) {
      uVar3 = this->Column;
      if (local_34 < uVar3) {
        *local_40 = uVar3;
        if (uVar9 <= uVar3) {
          return true;
        }
        Twine::Twine(&local_58,"Leading all-spaces line must be smaller than the block indent");
        setError(this,&local_58,unaff_RBX);
        return false;
      }
LAB_00b32837:
      *IsDone = true;
      return true;
    }
    pcVar4 = this->End;
    pcVar8 = pcVar6;
    if (pcVar4 != pcVar6) {
      if (*pcVar2 == '\n') {
        pcVar8 = pcVar2 + 1;
      }
      else if (((*pcVar2 == '\r') && (pcVar8 = pcVar4, pcVar2 + 1 != pcVar4)) &&
              (pcVar8 = pcVar2 + 1, pcVar2[1] == '\n')) {
        pcVar8 = pcVar2 + 2;
      }
    }
    uVar3 = this->Column;
    if (this->Column <= uVar9) {
      uVar3 = uVar9;
      pcVar2 = unaff_RBX;
    }
    if (pcVar8 != pcVar6) {
      uVar9 = uVar3;
      unaff_RBX = pcVar2;
    }
    if ((pcVar4 == pcVar6) || (bVar5 = consumeLineBreakIfPresent(this), !bVar5)) goto LAB_00b32837;
    *LineBreaks = *LineBreaks + 1;
  } while( true );
}

Assistant:

bool Scanner::findBlockScalarIndent(unsigned &BlockIndent,
                                    unsigned BlockExitIndent,
                                    unsigned &LineBreaks, bool &IsDone) {
  unsigned MaxAllSpaceLineCharacters = 0;
  StringRef::iterator LongestAllSpaceLine;

  while (true) {
    advanceWhile(&Scanner::skip_s_space);
    if (skip_nb_char(Current) != Current) {
      // This line isn't empty, so try and find the indentation.
      if (Column <= BlockExitIndent) { // End of the block literal.
        IsDone = true;
        return true;
      }
      // We found the block's indentation.
      BlockIndent = Column;
      if (MaxAllSpaceLineCharacters > BlockIndent) {
        setError(
            "Leading all-spaces line must be smaller than the block indent",
            LongestAllSpaceLine);
        return false;
      }
      return true;
    }
    if (skip_b_break(Current) != Current &&
        Column > MaxAllSpaceLineCharacters) {
      // Record the longest all-space line in case it's longer than the
      // discovered block indent.
      MaxAllSpaceLineCharacters = Column;
      LongestAllSpaceLine = Current;
    }

    // Check for EOF.
    if (Current == End) {
      IsDone = true;
      return true;
    }

    if (!consumeLineBreakIfPresent()) {
      IsDone = true;
      return true;
    }
    ++LineBreaks;
  }
  return true;
}